

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O0

void beltHashStepH(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  u32 *in_RSI;
  undefined8 *in_RDI;
  belt_hash_st *st;
  void *in_stack_ffffffffffffffd8;
  u32 *h;
  undefined8 *local_8;
  
  h = in_RDX;
  beltBlockAddBitSizeU32(in_RDX,(size_t)in_RSI);
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x24) != 0) {
    if (in_RSI < (u32 *)(0x20U - *(long *)(in_RDX + 0x24))) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x14a6ce);
      *(long *)(in_RDX + 0x24) = (long)in_RSI + *(long *)(in_RDX + 0x24);
      return;
    }
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x14a71b);
    in_RSI = (u32 *)((long)in_RSI - (0x20 - *(long *)(in_RDX + 0x24)));
    local_8 = (undefined8 *)((long)in_RDI + (0x20 - *(long *)(in_RDX + 0x24)));
    beltCompr2(in_RSI,h,in_RDX,in_stack_ffffffffffffffd8);
    in_RDX[0x24] = 0;
    in_RDX[0x25] = 0;
  }
  for (; (u32 *)0x1f < in_RSI; in_RSI = in_RSI + -8) {
    *(undefined8 *)(in_RDX + 0x1c) = *local_8;
    *(undefined8 *)(in_RDX + 0x1e) = local_8[1];
    *(undefined8 *)(in_RDX + 0x20) = local_8[2];
    *(undefined8 *)(in_RDX + 0x22) = local_8[3];
    beltCompr2(in_RSI,h,in_RDX,in_stack_ffffffffffffffd8);
    local_8 = local_8 + 4;
  }
  if (in_RSI != (u32 *)0x0) {
    *(u32 **)(in_RDX + 0x24) = in_RSI;
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x14a867);
  }
  return;
}

Assistant:

void beltHashStepH(const void* buf, size_t count, void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltHash_keep()));
	// обновить длину
	beltBlockAddBitSizeU32(st->ls, count);
	// есть накопленные данные?
	if (st->filled)
	{
		if (count < 32 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 32 - st->filled);
		count -= 32 - st->filled;
		buf = (const octet*)buf + (32 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls + 4, st->h, (u32*)st->block, st->stack);
		st->filled = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		beltBlockCopy(st->block, buf);
		beltBlockCopy(st->block + 16, (const octet*)buf + 16);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls + 4, st->h, (u32*)st->block, st->stack);
		buf = (const octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
		memCopy(st->block, buf, st->filled = count);
}